

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

int OSSL_PARAM_get_BN(OSSL_PARAM *p,BIGNUM **val)

{
  BIGNUM *pBVar1;
  undefined8 *in_RSI;
  uchar *in_RDI;
  BIGNUM *b;
  BIGNUM *in_stack_ffffffffffffffe0;
  int local_4;
  
  if (((in_RSI == (undefined8 *)0x0) || (in_RDI == (uchar *)0x0)) || (*(int *)(in_RDI + 8) != 2)) {
    local_4 = 0;
  }
  else {
    pBVar1 = BN_native2bn(in_RDI,(int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe0);
    if (pBVar1 == (BIGNUM *)0x0) {
      local_4 = 0;
    }
    else {
      *in_RSI = pBVar1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int OSSL_PARAM_get_BN(const OSSL_PARAM *p, BIGNUM **val)
{
    BIGNUM *b;

    if (val == NULL
        || p == NULL
        || p->data_type != OSSL_PARAM_UNSIGNED_INTEGER)
        return 0;

    b = BN_native2bn(p->data, (int)p->data_size, *val);
    if (b != NULL) {
        *val = b;
        return 1;
    }
    return 0;
}